

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O3

void poll_cb(uv_fs_t *req)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  lVar1 = req[-1].statbuf.st_atim.tv_nsec;
  if (lVar1 == 0) {
    uv_close((uv_handle_t *)&req[-1].statbuf.st_birthtim,timer_close_cb);
    uv_fs_req_cleanup(req);
    return;
  }
  lVar2 = req->result;
  if (lVar2 == 0) {
    iVar3 = (int)req[-1].statbuf.st_mtim.tv_sec;
    if ((iVar3 != 0) &&
       (((((iVar3 < 0 || (req[1].statbuf.st_size != (req->statbuf).st_ctim.tv_nsec)) ||
          (req[1].statbuf.st_rdev != (req->statbuf).st_mtim.tv_nsec)) ||
         (((req[1].statbuf.st_blocks != (req->statbuf).st_birthtim.tv_nsec ||
           (req[1].statbuf.st_ino != (req->statbuf).st_ctim.tv_sec)) ||
          ((req[1].statbuf.st_gid != (req->statbuf).st_mtim.tv_sec ||
           ((req[1].statbuf.st_blksize != (req->statbuf).st_birthtim.tv_sec ||
            (req[1].result != (req->statbuf).st_size)))))))) ||
        ((*(uint64_t *)&req[1].type != (req->statbuf).st_mode ||
         (((((req[1].active_queue[1] != (void *)(req->statbuf).st_uid ||
             (*(uint64_t *)&req[1].fs_type != (req->statbuf).st_gid)) ||
            (req[1].cb != (uv_fs_cb)(req->statbuf).st_ino)) ||
           ((req[1].data != (void *)(req->statbuf).st_dev ||
            (req[1].statbuf.st_dev != (req->statbuf).st_flags)))) ||
          (req[1].statbuf.st_mode != (req->statbuf).st_gen)))))))) {
      (*(code *)req[-1].statbuf.st_ctim.tv_nsec)(lVar1,0,req + 1);
    }
    memcpy(req + 1,&req->statbuf,0xa0);
    *(undefined4 *)&req[-1].statbuf.st_mtim.tv_sec = 1;
  }
  else if (lVar2 != (int)req[-1].statbuf.st_mtim.tv_sec) {
    (*(code *)req[-1].statbuf.st_ctim.tv_nsec)(lVar1,lVar2,req + 1);
    *(int *)&req[-1].statbuf.st_mtim.tv_sec = (int)req->result;
  }
  uv_fs_req_cleanup(req);
  if (req[-1].statbuf.st_atim.tv_nsec != 0) {
    uVar5 = (ulong)*(uint *)((long)&req[-1].statbuf.st_mtim.tv_sec + 4);
    uVar4 = uv_now((uv_loop_t *)req[-1].statbuf.st_ctim.tv_sec);
    iVar3 = uv_timer_start((uv_timer_t *)&req[-1].statbuf.st_birthtim,timer_cb,
                           uVar5 - (uVar4 - req[-1].statbuf.st_mtim.tv_nsec) % uVar5,0);
    if (iVar3 == 0) {
      return;
    }
    abort();
  }
  uv_close((uv_handle_t *)&req[-1].statbuf.st_birthtim,timer_close_cb);
  return;
}

Assistant:

static void poll_cb(uv_fs_t* req) {
  uv_stat_t* statbuf;
  struct poll_ctx* ctx;
  uint64_t interval;

  ctx = container_of(req, struct poll_ctx, fs_req);

  if (ctx->parent_handle == NULL) { /* handle has been stopped or closed */
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    uv_fs_req_cleanup(req);
    return;
  }

  if (req->result != 0) {
    if (ctx->busy_polling != req->result) {
      ctx->poll_cb(ctx->parent_handle,
                   req->result,
                   &ctx->statbuf,
                   &zero_statbuf);
      ctx->busy_polling = req->result;
    }
    goto out;
  }

  statbuf = &req->statbuf;

  if (ctx->busy_polling != 0)
    if (ctx->busy_polling < 0 || !statbuf_eq(&ctx->statbuf, statbuf))
      ctx->poll_cb(ctx->parent_handle, 0, &ctx->statbuf, statbuf);

  ctx->statbuf = *statbuf;
  ctx->busy_polling = 1;

out:
  uv_fs_req_cleanup(req);

  if (ctx->parent_handle == NULL) { /* handle has been stopped by callback */
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    return;
  }

  /* Reschedule timer, subtract the delay from doing the stat(). */
  interval = ctx->interval;
  interval -= (uv_now(ctx->loop) - ctx->start_time) % interval;

  if (uv_timer_start(&ctx->timer_handle, timer_cb, interval, 0))
    abort();
}